

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O0

_Bool dir_create(char *path)

{
  _Bool _Var1;
  int iVar2;
  long lVar3;
  size_t len;
  char buf [512];
  char *local_20;
  char *ptr;
  char *path_local;
  
  _Var1 = dir_exists(path);
  local_20 = path;
  if (_Var1) {
    path_local._7_1_ = true;
  }
  else {
    for (; *local_20 != '\0'; local_20 = local_20 + 1) {
      if (((*local_20 == '/') && (lVar3 = (long)local_20 - (long)path, lVar3 != 0)) &&
         (local_20[-1] != '/')) {
        if (0x200 < lVar3 - 1U) {
          return false;
        }
        my_strcpy((char *)&len,path,lVar3 + 1);
        _Var1 = dir_exists((char *)&len);
        if ((!_Var1) && (iVar2 = mkdir((char *)&len,0x1ed), iVar2 != 0)) {
          return false;
        }
      }
    }
    iVar2 = mkdir(path,0x1ed);
    path_local._7_1_ = iVar2 == 0;
  }
  return path_local._7_1_;
}

Assistant:

bool dir_create(const char *path)
{
	const char *ptr;
	char buf[512];

	/* If the directory already exists then we're done */
	if (dir_exists(path)) return true;

	#ifdef WINDOWS
	/* If we're on windows, we need to skip past the "C:" part. */
	if (isalpha(path[0]) && path[1] == ':') path += 2;
	#endif

	/* Iterate through the path looking for path segments. At each step,
	 * create the path segment if it doesn't already exist. */
	for (ptr = path; *ptr; ptr++) {
		if (*ptr == PATH_SEPC) {
			/* Find the length of the parent path string */
			size_t len = (size_t)(ptr - path);

			/* Skip the initial slash */
			if (len == 0) continue;

			/* If this is a duplicate path separator, continue */
			if (*(ptr - 1) == PATH_SEPC) continue;

			/* We can't handle really big filenames */
			if (len - 1 > 512) return false;

			/* Create the parent path string, plus null-padding */
			my_strcpy(buf, path, len + 1);

			/* Skip if the parent exists */
			if (dir_exists(buf)) continue;

			/* The parent doesn't exist, so create it or fail */
			if (my_mkdir(buf, 0755) != 0) return false;
		}
	}
	return my_mkdir(path, 0755) == 0 ? true : false;
}